

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterized.cpp
# Opt level: O0

void __thiscall
iu_TestP_x_iutest_x_TestB_Test::iu_TestP_x_iutest_x_TestB_Test(iu_TestP_x_iutest_x_TestB_Test *this)

{
  iu_TestP_x_iutest_x_TestB_Test *this_local;
  
  TestP::TestP(&this->super_type);
  (this->super_type).super_TestWithParam<int>.super_Test._vptr_Test =
       (_func_int **)&PTR__iu_TestP_x_iutest_x_TestB_Test_003a0bd8;
  (this->super_type).super_TestWithParam<int>.super_WithParamInterface<int>._vptr_WithParamInterface
       = (_func_int **)&PTR__iu_TestP_x_iutest_x_TestB_Test_003a0c18;
  return;
}

Assistant:

IUTEST_P(TestP, TestB)
{
    IUTEST_ASSERT_EQ(b, GetParam());
    ++b;
}